

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

ly_set * lyd_find_instance(lyd_node *data,lys_node *schema)

{
  lyd_node **pplVar1;
  uint8_t *puVar2;
  uint uVar3;
  lyd_node *plVar4;
  ly_set *set;
  ly_set *set_00;
  lyd_node *node;
  ly_set *set_01;
  lys_node *plVar5;
  long lVar6;
  ulong uVar7;
  
  if ((schema == (lys_node *)0x0 || data == (lyd_node *)0x0) ||
     ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_find_instance");
    return (ly_set *)0x0;
  }
  set = ly_set_new();
  set_00 = ly_set_new();
  if (set_00 != (ly_set *)0x0 && set != (ly_set *)0x0) {
    do {
      pplVar1 = &data->parent;
      plVar4 = data;
      data = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      node = plVar4;
      plVar4 = node->prev;
      plVar5 = schema;
    } while (node->prev->next != (lyd_node *)0x0);
    do {
      lVar6 = 0x58;
      if ((plVar5->nodetype != LYS_AUGMENT) &&
         (lVar6 = 0x40, (plVar5->nodetype & 0xc1bd) != LYS_UNKNOWN)) {
        ly_set_add(set_00,plVar5,1);
      }
      puVar2 = plVar5->padding;
      plVar5 = *(lys_node **)(puVar2 + lVar6 + -0x1c);
    } while (*(lys_node **)(puVar2 + lVar6 + -0x1c) != (lys_node *)0x0);
    if (set_00->number == 0) goto LAB_0016f3bb;
    for (; node != (lyd_node *)0x0; node = node->next) {
      if (node->schema == (set_00->set).s[set_00->number - 1]) {
        ly_set_add(set,node,1);
      }
    }
    uVar3 = set_00->number;
    while( true ) {
      if ((uVar3 - 1 == 0) || (set->number == 0)) {
        free((set_00->set).s);
        free(set_00);
        return set;
      }
      set_01 = ly_set_new();
      if (set_01 == (ly_set *)0x0) break;
      if (set->number != 0) {
        uVar7 = 0;
        do {
          for (plVar5 = (set->set).s[uVar7]->parent; plVar5 != (lys_node *)0x0;
              plVar5 = *(lys_node **)&plVar5->flags) {
            if ((lys_node *)plVar5->name == (set_00->set).s[uVar3 - 2]) {
              ly_set_add(set_01,plVar5,1);
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < set->number);
      }
      free((set->set).s);
      free(set);
      uVar3 = uVar3 - 1;
      set = set_01;
    }
  }
  ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_find_instance"
        );
LAB_0016f3bb:
  ly_set_free(set);
  ly_set_free(set_00);
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_instance(const struct lyd_node *data, const struct lys_node *schema)
{
    struct ly_set *ret, *ret_aux, *spath;
    const struct lys_node *siter;
    struct lyd_node *iter;
    unsigned int i, j;

    if (!data || !schema ||
            !(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        LOGARG;
        return NULL;
    }

    ret = ly_set_new();
    spath = ly_set_new();
    if (!ret || !spath) {
        LOGMEM(schema->module->ctx);
        goto error;
    }

    /* find data root */
    while (data->parent) {
        /* vertical move (up) */
        data = data->parent;
    }
    while (data->prev->next) {
        /* horizontal move (left) */
        data = data->prev;
    }

    /* build schema path */
    for (siter = schema; siter; ) {
        if (siter->nodetype == LYS_AUGMENT) {
            siter = ((struct lys_node_augment *)siter)->target;
            continue;
        } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
            /* standard data node */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);

        } /* else skip the rest node types */
        siter = siter->parent;
    }
    if (!spath->number) {
        /* no valid path */
        goto error;
    }

    /* start searching */
    LY_TREE_FOR((struct lyd_node *)data, iter) {
        if (iter->schema == spath->set.s[spath->number - 1]) {
            ly_set_add(ret, iter, LY_SET_OPT_USEASLIST);
        }
    }
    for (i = spath->number - 1; i; i--) {
        if (!ret->number) {
            /* nothing found */
            break;
        }

        ret_aux = ly_set_new();
        if (!ret_aux) {
            LOGMEM(schema->module->ctx);
            goto error;
        }
        for (j = 0; j < ret->number; j++) {
            LY_TREE_FOR(ret->set.d[j]->child, iter) {
                if (iter->schema == spath->set.s[i - 1]) {
                    ly_set_add(ret_aux, iter, LY_SET_OPT_USEASLIST);
                }
            }
        }
        ly_set_free(ret);
        ret = ret_aux;
    }

    ly_set_free(spath);
    return ret;

error:
    ly_set_free(ret);
    ly_set_free(spath);

    return NULL;
}